

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cc
# Opt level: O1

void __thiscall
onmt::Tokenizer::Tokenizer
          (Tokenizer *this,Options *options,shared_ptr<const_onmt::SubwordEncoder> *subword_encoder)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  pointer pbVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  
  (this->super_ITokenizer)._vptr_ITokenizer = (_func_int **)&PTR__Tokenizer_00381050;
  (this->_options).mode = options->mode;
  paVar1 = &(this->_options).lang.field_2;
  (this->_options).lang._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (options->lang)._M_dataplus._M_p;
  paVar2 = &(options->lang).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(options->lang).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->_options).lang.field_2 + 8) = uVar4;
  }
  else {
    (this->_options).lang._M_dataplus._M_p = pcVar3;
    (this->_options).lang.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->_options).lang._M_string_length = (options->lang)._M_string_length;
  (options->lang)._M_dataplus._M_p = (pointer)paVar2;
  (options->lang)._M_string_length = 0;
  (options->lang).field_2._M_local_buf[0] = '\0';
  bVar6 = options->case_feature;
  bVar7 = options->case_markup;
  bVar8 = options->soft_case_regions;
  bVar9 = options->with_separators;
  bVar10 = options->allow_isolated_marks;
  bVar11 = options->joiner_annotate;
  bVar12 = options->joiner_new;
  (this->_options).no_substitution = options->no_substitution;
  (this->_options).case_feature = bVar6;
  (this->_options).case_markup = bVar7;
  (this->_options).soft_case_regions = bVar8;
  (this->_options).with_separators = bVar9;
  (this->_options).allow_isolated_marks = bVar10;
  (this->_options).joiner_annotate = bVar11;
  (this->_options).joiner_new = bVar12;
  paVar1 = &(this->_options).joiner.field_2;
  (this->_options).joiner._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (options->joiner)._M_dataplus._M_p;
  paVar2 = &(options->joiner).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(options->joiner).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->_options).joiner.field_2 + 8) = uVar4;
  }
  else {
    (this->_options).joiner._M_dataplus._M_p = pcVar3;
    (this->_options).joiner.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->_options).joiner._M_string_length = (options->joiner)._M_string_length;
  (options->joiner)._M_dataplus._M_p = (pointer)paVar2;
  (options->joiner)._M_string_length = 0;
  (options->joiner).field_2._M_local_buf[0] = '\0';
  bVar6 = options->spacer_new;
  bVar7 = options->preserve_placeholders;
  bVar8 = options->preserve_segmented_tokens;
  bVar9 = options->support_prior_joiners;
  bVar10 = options->segment_case;
  bVar11 = options->segment_numbers;
  bVar12 = options->segment_alphabet_change;
  (this->_options).spacer_annotate = options->spacer_annotate;
  (this->_options).spacer_new = bVar6;
  (this->_options).preserve_placeholders = bVar7;
  (this->_options).preserve_segmented_tokens = bVar8;
  (this->_options).support_prior_joiners = bVar9;
  (this->_options).segment_case = bVar10;
  (this->_options).segment_numbers = bVar11;
  (this->_options).segment_alphabet_change = bVar12;
  pbVar5 = (options->segment_alphabet).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->_options).segment_alphabet.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (options->segment_alphabet).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->_options).segment_alphabet.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar5;
  (this->_options).segment_alphabet.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (options->segment_alphabet).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (options->segment_alphabet).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (options->segment_alphabet).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (options->segment_alphabet).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::_Hashtable(&(this->_options).segment_alphabet_codes._M_h,&options->segment_alphabet_codes,
               &options->segment_alphabet_codes);
  (this->_subword_encoder).
  super___shared_ptr<const_onmt::SubwordEncoder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_subword_encoder).
  super___shared_ptr<const_onmt::SubwordEncoder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Options::validate(&this->_options);
  set_subword_encoder(this,subword_encoder);
  return;
}

Assistant:

Tokenizer::Tokenizer(Options options,
                       const std::shared_ptr<const SubwordEncoder>& subword_encoder)
    : _options(std::move(options))
  {
    _options.validate();
    set_subword_encoder(subword_encoder);
  }